

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O0

void __thiscall GraphSam::swap(GraphSam *this,int a,int b)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  __shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  shared_ptr<GraphNode> *m;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_> *__range3;
  shared_ptr<GraphNode> *n;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_> *__range1;
  int b_local;
  int a_local;
  GraphSam *this_local;
  
  if (a != b) {
    __end1 = std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::
             begin(&this->m_nodes);
    n = (shared_ptr<GraphNode> *)
        std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::end
                  (&this->m_nodes);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
                                       *)&n), bVar1) {
      this_00 = (__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
                ::operator*(&__end1);
      peVar3 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      iVar2 = GraphNode::getValue(peVar3);
      if (iVar2 == a) {
        __end3 = std::
                 vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::
                 begin(&this->m_nodes);
        m = (shared_ptr<GraphNode> *)
            std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::
            end(&this->m_nodes);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
                                           *)&m), bVar1) {
          this_01 = (__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    __gnu_cxx::
                    __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
                    ::operator*(&__end3);
          peVar3 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_01);
          iVar2 = GraphNode::getValue(peVar3);
          if (iVar2 == b) {
            peVar3 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(this_00);
            GraphNode::setValue(peVar3,b);
            peVar3 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(this_01);
            GraphNode::setValue(peVar3,a);
            return;
          }
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
          ::operator++(&__end3);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void GraphSam::swap(int a, int b) {

    if (a == b) return;

    for (auto &n : m_nodes) {
        if (n->getValue() == a) {
            for (auto &m : m_nodes) {
                if (m->getValue() == b) {
                    n->setValue(b);
                    m->setValue(a);
                    return;
                }
            }
        }
    }

}